

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

bool __thiscall
cinatra::coro_http_client::has_schema<std::__cxx11::string>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url)

{
  char *__s;
  size_type __pos;
  size_type sVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  bool has_http_scheme;
  size_t pos_wss;
  size_t pos_ws;
  size_t pos_https;
  size_t pos_http;
  bool local_33;
  bool local_32;
  size_type in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  __s = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_RSI,__s,in_stack_ffffffffffffffe0);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_RSI,__s,__pos);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_RSI,__s,__pos);
  if ((((__s == (char *)0xffffffffffffffff) || (local_32 = true, __s != (char *)0x0)) &&
      ((__pos == 0xffffffffffffffff || (local_32 = true, __pos != 0)))) &&
     ((sVar1 == 0xffffffffffffffff || (local_32 = true, sVar1 != 0)))) {
    local_33 = sVar2 == 0;
    local_32 = local_33;
  }
  return local_32;
}

Assistant:

bool has_schema(const S &url) {
    size_t pos_http = url.find("http://");
    size_t pos_https = url.find("https://");
    size_t pos_ws = url.find("ws://");
    size_t pos_wss = url.find("wss://");
    bool has_http_scheme =
        ((pos_http != std::string::npos) && pos_http == 0) ||
        ((pos_https != std::string::npos) && pos_https == 0) ||
        ((pos_ws != std::string::npos) && pos_ws == 0) ||
        ((pos_wss != std::string::npos) && pos_wss == 0);
    return has_http_scheme;
  }